

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book_perf_test.cc
# Opt level: O0

type test_remove(order_book *ob,unsigned_long count)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__rhs;
  type tVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  order_book *in_RDI;
  time_point end;
  unsigned_long i;
  time_point start;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  
  std::chrono::_V2::system_clock::now();
  for (__lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)0x0; __lhs < in_RSI;
      __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               *)((long)&(__lhs->__d).__r + 1)) {
    helix::order_book::remove(in_RDI,(char *)__lhs);
  }
  __rhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::operator-(__lhs,__rhs);
  return (type)tVar1.__r;
}

Assistant:

auto test_remove(order_book& ob, unsigned long count)
{
    auto start = clock_type::now();
    for (unsigned long i = 0; i < count; i++) {
        ob.remove(i);
    }
    auto end = clock_type::now();
    return end - start;
}